

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

Node<QFontDatabase::WritingSystem,_QString> * __thiscall
QHashPrivate::Data<QHashPrivate::Node<QFontDatabase::WritingSystem,_QString>_>::
findNode<QFontDatabase::WritingSystem>
          (Data<QHashPrivate::Node<QFontDatabase::WritingSystem,_QString>_> *this,WritingSystem *key
          )

{
  long lVar1;
  bool bVar2;
  Node<QFontDatabase::WritingSystem,_QString> *pNVar3;
  WritingSystem *in_RDI;
  long in_FS_OFFSET;
  Bucket bucket;
  Data<QHashPrivate::Node<QFontDatabase::WritingSystem,_QString>_> *in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  findBucket<QFontDatabase::WritingSystem>(in_stack_ffffffffffffffe0,in_RDI);
  bVar2 = Bucket::isUnused((Bucket *)0x5a042b);
  if (bVar2) {
    pNVar3 = (Node<QFontDatabase::WritingSystem,_QString> *)0x0;
  }
  else {
    pNVar3 = Bucket::node((Bucket *)0x5a0446);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pNVar3;
  }
  __stack_chk_fail();
}

Assistant:

Node *findNode(const K &key) const noexcept
    {
        auto bucket = findBucket(key);
        if (bucket.isUnused())
            return nullptr;
        return bucket.node();
    }